

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_SubDMeshFragment::VertexPoint
          (ON_3dPoint *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_point_index)

{
  double dVar1;
  uint uVar2;
  
  uVar2 = PointCount(this);
  if (grid_point_index < uVar2) {
    ON_3dPoint::ON_3dPoint
              (__return_storage_ptr__,this->m_P + (ulong)grid_point_index * this->m_P_stride);
  }
  else {
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
    dVar1 = ON_3dPoint::NanPoint.y;
    __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
    __return_storage_ptr__->y = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDMeshFragment::VertexPoint(
  unsigned grid_point_index
) const
{
  if (grid_point_index >= (unsigned)PointCount())
    return ON_3dPoint::NanPoint;
  return ON_3dPoint(m_P + grid_point_index * m_P_stride);
}